

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

owner * store_ownerbyidx(store *s,uint idx)

{
  store *psVar1;
  
  psVar1 = s;
  do {
    psVar1 = (store *)psVar1->owners;
    if (psVar1 == (store *)0x0) {
      if (s->sidx == store_home_idx) {
        return (owner *)0x0;
      }
      quit_fmt("Bad call to store_ownerbyidx: idx is %d\n");
      return (owner *)0x0;
    }
  } while (*(uint *)&psVar1->next != idx);
  return (owner *)psVar1;
}

Assistant:

struct owner *store_ownerbyidx(struct store *s, unsigned int idx) {
	struct owner *o;
	for (o = s->owners; o; o = o->next) {
		if (o->oidx == idx)
			return o;
	}

	/* Allow no owner for home */
	if (!store_is_home(s))
		quit_fmt("Bad call to store_ownerbyidx: idx is %d\n", idx);

	return NULL;
}